

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void * prf_array_insert_ptr(void *id,int idx,void *elem)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  
  uVar1 = *(uint *)((long)id + -4);
  pvVar2 = prf_array_append_ptr(id,elem);
  if (idx < (int)(uVar1 >> 4)) {
    for (uVar3 = (ulong)(uVar1 >> 4); (long)idx < (long)uVar3; uVar3 = uVar3 - 1) {
      *(undefined8 *)((long)pvVar2 + uVar3 * 8) = *(undefined8 *)((long)pvVar2 + uVar3 * 8 + -8);
    }
    *(void **)((long)pvVar2 + (long)idx * 8) = elem;
  }
  return pvVar2;
}

Assistant:

void *
prf_array_insert_ptr(void *id, int idx, void *elem)
{
  int i, n;
  void **ptr;

  n = id_to_array(id)->numelem;

  /* make room for one more */
  ptr = (void**)prf_array_append_ptr(id, elem);

  if (idx < n) {
    for (i = n; i > idx; i--) {
      ptr[i] = ptr[i-1]; 
    }
    ptr[idx] = elem;
  }
  return ptr;
}